

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

string * __thiscall
flatbuffers::ts::TsGenerator::GenDefaultValue
          (string *__return_storage_ptr__,TsGenerator *this,FieldDef *field,import_set *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  EnumDef *pEVar3;
  bool bVar4;
  EnumVal *pEVar5;
  uint uVar6;
  char *pcVar7;
  string *s;
  string enum_name;
  string enum_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  IdlNamer *local_178;
  string *local_170;
  TsGenerator *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  ImportDefinition local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BVar2 = (field->value).type.base_type;
  if ((BVar2 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
switchD_001c9bbc_caseD_10:
    pcVar7 = "null";
  }
  else {
    pEVar3 = (field->value).type.enum_def;
    if (pEVar3 != (EnumDef *)0x0) {
      switch(BVar2) {
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG:
        std::operator+(&local_140.name,"BigInt(\'",&(field->value).constant);
        std::operator+(__return_storage_ptr__,&local_140.name,"\')");
        goto LAB_001c9c3c;
      default:
        pEVar5 = EnumDef::FindByValue(pEVar3,&(field->value).constant);
        if (pEVar5 == (EnumVal *)0x0) {
          pEVar5 = EnumDef::MinValue((field->value).type.enum_def);
        }
        pEVar3 = (field->value).type.enum_def;
        AddImport<flatbuffers::EnumDef>(&local_140,this,imports,&pEVar3->super_Definition,pEVar3);
        std::operator+(&local_198,&local_140.name,".");
        (*(this->namer_).super_Namer._vptr_Namer[0x13])(&local_160,&this->namer_,pEVar5);
        std::operator+(__return_storage_ptr__,&local_198,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_198);
        anon_unknown_10::ImportDefinition::~ImportDefinition(&local_140);
        return __return_storage_ptr__;
      case BASE_TYPE_VECTOR:
        goto switchD_001c9bbc_caseD_e;
      case BASE_TYPE_UNION:
        goto switchD_001c9bbc_caseD_10;
      case BASE_TYPE_ARRAY:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"[",(allocator<char> *)&local_140);
        local_170 = &(field->value).constant;
        local_178 = &this->namer_;
        local_168 = this;
        for (uVar6 = 0; uVar6 < (field->value).type.fixed_length; uVar6 = uVar6 + 1) {
          pEVar3 = (field->value).type.enum_def;
          AddImport<flatbuffers::EnumDef>
                    (&local_140,local_168,imports,&pEVar3->super_Definition,pEVar3);
          paVar1 = &local_140.name.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140.name._M_dataplus._M_p == paVar1) {
            local_198.field_2._8_8_ = local_140.name.field_2._8_8_;
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          }
          else {
            local_198._M_dataplus._M_p = local_140.name._M_dataplus._M_p;
          }
          local_198.field_2._M_allocated_capacity._1_7_ =
               local_140.name.field_2._M_allocated_capacity._1_7_;
          local_198.field_2._M_local_buf[0] = local_140.name.field_2._M_local_buf[0];
          local_198._M_string_length = local_140.name._M_string_length;
          local_140.name._M_string_length = 0;
          local_140.name.field_2._M_local_buf[0] = '\0';
          local_140.name._M_dataplus._M_p = (pointer)paVar1;
          anon_unknown_10::ImportDefinition::~ImportDefinition(&local_140);
          pEVar5 = EnumDef::FindByValue((field->value).type.enum_def,local_170);
          (*(local_178->super_Namer)._vptr_Namer[0x13])(&local_140,local_178,pEVar5);
          std::operator+(&local_70,&local_198,".");
          std::operator+(&local_50,&local_70,&local_140.name);
          pcVar7 = "";
          if ((int)uVar6 < (int)((field->value).type.fixed_length - 1)) {
            pcVar7 = ", ";
          }
          std::operator+(&local_160,&local_50,pcVar7);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_198);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
    }
    switch(BVar2) {
    case BASE_TYPE_BOOL:
      bVar4 = std::operator==(&(field->value).constant,"0");
      pcVar7 = "true";
      if (bVar4) {
        pcVar7 = "false";
      }
      break;
    default:
      s = &(field->value).constant;
      bVar4 = StringIsFlatbufferNan(s);
      if (bVar4) {
        pcVar7 = "NaN";
      }
      else {
        bVar4 = StringIsFlatbufferPositiveInfinity(s);
        if (bVar4) {
          pcVar7 = "Infinity";
        }
        else {
          bVar4 = StringIsFlatbufferNegativeInfinity(s);
          if (!bVar4) {
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
            return __return_storage_ptr__;
          }
          pcVar7 = "-Infinity";
        }
      }
      break;
    case BASE_TYPE_LONG:
    case BASE_TYPE_ULONG:
      std::operator+(&local_140.name,"BigInt(\'",&(field->value).constant);
      std::operator+(__return_storage_ptr__,&local_140.name,"\')");
LAB_001c9c3c:
      std::__cxx11::string::~string((string *)&local_140);
      return __return_storage_ptr__;
    case BASE_TYPE_STRING:
    case BASE_TYPE_STRUCT:
    case BASE_TYPE_UNION:
      goto switchD_001c9bbc_caseD_10;
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_ARRAY:
switchD_001c9bbc_caseD_e:
      pcVar7 = "[]";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar7,(allocator<char> *)&local_140);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const FieldDef &field, import_set &imports) {
    if (field.IsScalarOptional()) { return "null"; }

    const auto &value = field.value;
    if (value.type.enum_def && value.type.base_type != BASE_TYPE_UNION &&
        value.type.base_type != BASE_TYPE_VECTOR) {
      switch (value.type.base_type) {
        case BASE_TYPE_ARRAY: {
          std::string ret = "[";
          for (auto i = 0; i < value.type.fixed_length; ++i) {
            std::string enum_name =
                AddImport(imports, *value.type.enum_def, *value.type.enum_def)
                    .name;
            std::string enum_value = namer_.Variant(
                *value.type.enum_def->FindByValue(value.constant));
            ret += enum_name + "." + enum_value +
                   (i < value.type.fixed_length - 1 ? ", " : "");
          }
          ret += "]";
          return ret;
        }
        case BASE_TYPE_LONG:
        case BASE_TYPE_ULONG: {
          // If the value is an enum with a 64-bit base type, we have to just
          // return the bigint value directly since typescript does not support
          // enums with bigint backing types.
          return "BigInt('" + value.constant + "')";
        }
        default: {
          EnumVal *val = value.type.enum_def->FindByValue(value.constant);
          if (val == nullptr)
            val = const_cast<EnumVal *>(value.type.enum_def->MinValue());
          return AddImport(imports, *value.type.enum_def, *value.type.enum_def)
                     .name +
                 "." + namer_.Variant(*val);
        }
      }
    }

    switch (value.type.base_type) {
      case BASE_TYPE_BOOL: return value.constant == "0" ? "false" : "true";

      case BASE_TYPE_STRING:
      case BASE_TYPE_UNION:
      case BASE_TYPE_STRUCT: {
        return "null";
      }

      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR: return "[]";

      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: {
        return "BigInt('" + value.constant + "')";
      }

      default: {
        if (StringIsFlatbufferNan(value.constant)) {
          return "NaN";
        } else if (StringIsFlatbufferPositiveInfinity(value.constant)) {
          return "Infinity";
        } else if (StringIsFlatbufferNegativeInfinity(value.constant)) {
          return "-Infinity";
        }
        return value.constant;
      }
    }
  }